

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unscaleDual(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *lp,
             VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *pi)

{
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  int i;
  long lVar4;
  long lVar5;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_68;
  
  lVar5 = 0xc;
  for (lVar4 = 0;
      pnVar3 = (pi->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)(((long)(pi->val).
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3) / 0x38);
      lVar4 = lVar4 + 1) {
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x30);
    local_a8 = *puVar1;
    uStack_a0 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x20);
    local_98 = *puVar1;
    uStack_90 = puVar1[1];
    local_88 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x10);
    local_80 = *(undefined4 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -8);
    local_7c = *(undefined1 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -4);
    local_78 = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              (&local_68,(soplex *)&local_a8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)(lp->
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).scaleExp.data[lVar4],(int)pnVar3);
    pnVar3 = (pi->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x10) =
         local_68.m_backend.data._M_elems._32_8_;
    puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x20);
    *(undefined8 *)puVar2 = local_68.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(puVar2 + 2) = local_68.m_backend.data._M_elems._24_8_;
    puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -0x30);
    *(undefined8 *)puVar2 = local_68.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(puVar2 + 2) = local_68.m_backend.data._M_elems._8_8_;
    *(int *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -8) = local_68.m_backend.exp;
    *(bool *)((long)&(pnVar3->m_backend).data + lVar5 * 4 + -4) = local_68.m_backend.neg;
    *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar5 * 4) = local_68.m_backend._48_8_;
    lVar5 = lVar5 + 0xe;
  }
  return;
}

Assistant:

void SPxScaler<R>::unscaleDual(const SPxLPBase<R>& lp, VectorBase<R>& pi) const
{
   assert(lp.isScaled());

   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   assert(pi.dim() == rowscaleExp.size());

   for(int i = 0; i < pi.dim(); ++i)
      pi[i] = spxLdexp(pi[i], rowscaleExp[i]);
}